

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O3

void __thiscall
QLoggingRegistry::registerCategory
          (QLoggingRegistry *this,QLoggingCategory *cat,QtMsgType enableForLevel)

{
  __pointer_type copy;
  long in_FS_OFFSET;
  bool bVar1;
  QtMsgType local_44;
  QLoggingCategory *local_40;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = enableForLevel;
  local_40 = cat;
  if ((this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_0024b1bf;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this);
LAB_0024b1bf:
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QLoggingCategory*,QtMsgType>::tryEmplace_impl<QLoggingCategory*const&,QtMsgType&>
            ((TryEmplaceResult *)local_38,(QHash<QLoggingCategory*,QtMsgType> *)&this->categories,
             &local_40,&local_44);
  if (local_38[0x10] == true) {
    (*this->categoryFilter)(local_40);
  }
  LOCK();
  copy = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLoggingRegistry::registerCategory(QLoggingCategory *cat, QtMsgType enableForLevel)
{
    const auto locker = qt_scoped_lock(registryMutex);

    auto r = categories.tryEmplace(cat, enableForLevel);
    if (r.inserted) {
        // new entry
        (*categoryFilter)(cat);
    }
}